

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::YieldToBlock
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,PolymorphicEmitInfo polyExpr)

{
  EmitInfo EVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  EmitInfo EVar4;
  EmitInfo EVar5;
  WasmCompilationException *this_00;
  uint uVar6;
  uint32 i;
  uint32 index;
  PolymorphicEmitInfo other;
  undefined1 auStack_68 [8];
  PolymorphicEmitInfo polyYieldInfo;
  undefined1 local_50 [8];
  PolymorphicEmitInfo polyExpr_local;
  
  uVar6 = polyExpr.count;
  if ((blockInfo->yieldInfo).count != 0) {
    local_50._0_4_ = uVar6;
    polyExpr_local._0_8_ = polyExpr.field_1;
    polyExpr_local.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)this;
    bVar2 = PolymorphicEmitInfo::IsUnreachable((PolymorphicEmitInfo *)local_50);
    if (!bVar2) {
      auStack_68._0_4_ = (blockInfo->yieldInfo).count;
      auStack_68._4_4_ = *(undefined4 *)&(blockInfo->yieldInfo).field_0x4;
      polyYieldInfo._0_8_ = (blockInfo->yieldInfo).field_1;
      other._4_4_ = 0;
      other.count = uVar6;
      other.field_1.singleInfo = polyExpr.field_1.singleInfo;
      bVar2 = PolymorphicEmitInfo::IsEquivalent((PolymorphicEmitInfo *)auStack_68,other);
      if (!bVar2) {
        this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException(this_00,L"Invalid yield type");
        __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      if ((char)polyExpr_local.field_1.infos[0x11].super_EmitInfoBase.location == '\0') {
        blockInfo->didYield = true;
        for (index = 0; uVar6 != index; index = index + 1) {
          EVar4 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_50,index);
          EVar5 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_68,index);
          EVar1 = polyExpr_local.field_1.infos[0x17];
          OVar3 = GetReturnOp((WasmBytecodeGenerator *)polyExpr_local.field_1.infos,EVar4.type);
          (**(code **)(*(long *)EVar1 + 0x78))
                    (EVar1,OVar3,(ulong)EVar5 & 0xffffffff,(ulong)EVar4 & 0xffffffff);
        }
      }
    }
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::YieldToBlock(BlockInfo* blockInfo, PolymorphicEmitInfo polyExpr)
{
    if (blockInfo->HasYield() && !polyExpr.IsUnreachable())
    {
        PolymorphicEmitInfo polyYieldInfo = blockInfo->yieldInfo;

        if (!polyYieldInfo.IsEquivalent(polyExpr))
        {
            throw WasmCompilationException(_u("Invalid yield type"));
        }

        if (!IsUnreachable())
        {
            blockInfo->didYield = true;
            for (uint32 i = 0; i < polyExpr.Count(); ++i)
            {
                EmitInfo expr = polyExpr.GetInfo(i);
                EmitInfo yieldInfo = polyYieldInfo.GetInfo(i);
                m_writer->AsmReg2(GetReturnOp(expr.type), yieldInfo.location, expr.location);
            }
        }
    }
}